

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_playback(Pager *pPager)

{
  int iVar1;
  int local_34;
  sxi64 sStack_30;
  int rc;
  sxi64 iOfft;
  sxu32 nRec;
  sxu32 n;
  uchar *zTmp;
  Pager *pPager_local;
  
  _nRec = (uchar *)0x0;
  zTmp = (uchar *)pPager;
  local_34 = pager_read_journal_header(pPager,(sxu32 *)&iOfft,&pPager->dbSize);
  if (local_34 == 0) {
    iVar1 = unqliteOsTruncate(*(unqlite_file **)(zTmp + 0x30),
                              (long)*(int *)(zTmp + 0x208) * *(long *)(zTmp + 0x40));
    if (iVar1 != 0) {
      unqliteGenError(*(unqlite **)(zTmp + 8),"IO error while truncating database file");
      return iVar1;
    }
    _nRec = (uchar *)SyMemBackendAlloc(*(SyMemBackend **)zTmp,*(sxu32 *)(zTmp + 0x208));
    if (_nRec == (uchar *)0x0) {
      unqliteGenOutofMem(*(unqlite **)(zTmp + 8));
      return -1;
    }
    SyZero(_nRec,*(sxu32 *)(zTmp + 0x208));
    sStack_30 = *(sxi64 *)(zTmp + 0x170);
    local_34 = 0;
    for (iOfft._4_4_ = 0; iOfft._4_4_ < (uint)iOfft; iOfft._4_4_ = iOfft._4_4_ + 1) {
      local_34 = pager_play_back_one_page((Pager *)zTmp,&stack0xffffffffffffffd0,_nRec);
      if ((local_34 != 0) && (local_34 != -0x3f)) {
        unqliteGenError(*(unqlite **)(zTmp + 8),"Page playback error");
        break;
      }
    }
  }
  else if (local_34 != -0x1c) {
    unqliteGenErrorFormat
              (*(unqlite **)(zTmp + 8),"IO error while reading journal file \'%s\' header",
               *(undefined8 *)(zTmp + 0x20));
    return local_34;
  }
  SyMemBackendFree(*(SyMemBackend **)zTmp,_nRec);
  if (local_34 == 0) {
    unqliteOsSync(*(unqlite_file **)(zTmp + 0x30),3);
  }
  if (local_34 == -0x1c) {
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static int pager_playback(Pager *pPager)
{
	unsigned char *zTmp = 0; /* cc warning */
	sxu32 n,nRec;
	sxi64 iOfft;
	int rc;
	/* Read the journal header*/
	rc = pager_read_journal_header(pPager,&nRec,&pPager->dbSize);
	if( rc != UNQLITE_OK ){
		if( rc == UNQLITE_DONE ){
			goto end_playback;
		}
		unqliteGenErrorFormat(pPager->pDb,"IO error while reading journal file '%s' header",pPager->zJournal);
		return rc;
	}
	/* Truncate the database back to its original size */
	rc = unqliteOsTruncate(pPager->pfd,pPager->iPageSize * pPager->dbSize);
	if( rc != UNQLITE_OK ){
		unqliteGenError(pPager->pDb,"IO error while truncating database file");
		return rc;
	}
	/* Allocate a temporary page */
	zTmp = (unsigned char *)SyMemBackendAlloc(pPager->pAllocator,(sxu32)pPager->iPageSize);
	if( zTmp == 0 ){
		unqliteGenOutofMem(pPager->pDb);
		return UNQLITE_NOMEM;
	}
	SyZero((void *)zTmp,(sxu32)pPager->iPageSize);
	/* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
	iOfft = pPager->iJournalOfft;
	for( n = 0 ; n < nRec ; ++n ){
		rc = pager_play_back_one_page(pPager,&iOfft,zTmp);
		if( rc != UNQLITE_OK ){
			if( rc != SXERR_IGNORE ){
				unqliteGenError(pPager->pDb,"Page playback error");
				goto end_playback;
			}
		}
	}
end_playback:
	/* Release the temp page */
	SyMemBackendFree(pPager->pAllocator,(void *)zTmp);
	if( rc == UNQLITE_OK ){
		/* Sync the database file */
		unqliteOsSync(pPager->pfd,UNQLITE_SYNC_FULL);
	}
	if( rc == UNQLITE_DONE ){
		rc = UNQLITE_OK;
	}
	/* Return to the caller */
	return rc;
}